

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O2

int __thiscall sznet::CountDownLatch::getCount(CountDownLatch *this)

{
  int iVar1;
  MutexLockGuard local_20;
  MutexLockGuard lock;
  
  local_20.m_mutex = &this->m_mutex;
  MutexLock::lock(local_20.m_mutex);
  iVar1 = this->m_count;
  MutexLockGuard::~MutexLockGuard(&local_20);
  return iVar1;
}

Assistant:

int CountDownLatch::getCount() const
{
	MutexLockGuard lock(m_mutex);
	return m_count;
}